

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.hpp
# Opt level: O2

void __thiscall
CLI::ArgumentMismatch::ArgumentMismatch
          (ArgumentMismatch *this,string *name,int expected,size_t recieved)

{
  string sStack_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if (expected < 1) {
    std::__cxx11::to_string(&local_68,-expected);
    ::std::operator+(&local_e8,"Expected at least ",&local_68);
    ::std::operator+(&local_c8,&local_e8," arguments to ");
    ::std::operator+(&local_a8,&local_c8,name);
    ::std::operator+(&local_88,&local_a8,", got ");
    std::__cxx11::to_string(&sStack_108,recieved);
    ::std::operator+(&local_48,&local_88,&sStack_108);
  }
  else {
    std::__cxx11::to_string(&local_68,expected);
    ::std::operator+(&local_e8,"Expected exactly ",&local_68);
    ::std::operator+(&local_c8,&local_e8," arguments to ");
    ::std::operator+(&local_a8,&local_c8,name);
    ::std::operator+(&local_88,&local_a8,", got ");
    std::__cxx11::to_string(&sStack_108,recieved);
    ::std::operator+(&local_48,&local_88,&sStack_108);
  }
  ArgumentMismatch(this,&local_48,ArgumentMismatch);
  ::std::__cxx11::string::~string((string *)&local_48);
  ::std::__cxx11::string::~string((string *)&sStack_108);
  ::std::__cxx11::string::~string((string *)&local_88);
  ::std::__cxx11::string::~string((string *)&local_a8);
  ::std::__cxx11::string::~string((string *)&local_c8);
  ::std::__cxx11::string::~string((string *)&local_e8);
  ::std::__cxx11::string::~string((string *)&local_68);
  return;
}

Assistant:

ArgumentMismatch(std::string name, int expected, size_t recieved)
        : ArgumentMismatch(expected > 0 ? ("Expected exactly " + std::to_string(expected) + " arguments to " + name +
                                           ", got " + std::to_string(recieved))
                                        : ("Expected at least " + std::to_string(-expected) + " arguments to " + name +
                                           ", got " + std::to_string(recieved)),
                           ExitCodes::ArgumentMismatch) {}